

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
            );
  internal::InitProtobufDefaults();
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&_FileDescriptorSet_default_instance_);
  DAT_0042fee0 = 1;
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)&_FileDescriptorProto_default_instance_);
  DAT_0042ffc0 = 1;
  DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
            ((DescriptorProto_ExtensionRange *)&_DescriptorProto_ExtensionRange_default_instance_);
  DAT_0042ffe8 = 1;
  DescriptorProto_ReservedRange::DescriptorProto_ReservedRange
            ((DescriptorProto_ReservedRange *)&_DescriptorProto_ReservedRange_default_instance_);
  DAT_00430010 = 1;
  DescriptorProto::DescriptorProto((DescriptorProto *)&_DescriptorProto_default_instance_);
  DAT_00430100 = 1;
  FieldDescriptorProto::FieldDescriptorProto
            ((FieldDescriptorProto *)&_FieldDescriptorProto_default_instance_);
  DAT_00430160 = 1;
  OneofDescriptorProto::OneofDescriptorProto
            ((OneofDescriptorProto *)&_OneofDescriptorProto_default_instance_);
  DAT_00430190 = 1;
  EnumDescriptorProto::EnumDescriptorProto
            ((EnumDescriptorProto *)&_EnumDescriptorProto_default_instance_);
  DAT_004301d8 = 1;
  EnumValueDescriptorProto::EnumValueDescriptorProto
            ((EnumValueDescriptorProto *)&_EnumValueDescriptorProto_default_instance_);
  DAT_00430210 = 1;
  ServiceDescriptorProto::ServiceDescriptorProto
            ((ServiceDescriptorProto *)&_ServiceDescriptorProto_default_instance_);
  DAT_00430258 = 1;
  MethodDescriptorProto::MethodDescriptorProto
            ((MethodDescriptorProto *)&_MethodDescriptorProto_default_instance_);
  DAT_004302a0 = 1;
  FileOptions::FileOptions((FileOptions *)&_FileOptions_default_instance_);
  DAT_00430358 = 1;
  MessageOptions::MessageOptions((MessageOptions *)&_MessageOptions_default_instance_);
  DAT_004303d0 = 1;
  FieldOptions::FieldOptions((FieldOptions *)&_FieldOptions_default_instance_);
  DAT_00430450 = 1;
  OneofOptions::OneofOptions((OneofOptions *)&_OneofOptions_default_instance_);
  DAT_004304c0 = 1;
  EnumOptions::EnumOptions((EnumOptions *)&_EnumOptions_default_instance_);
  DAT_00430538 = 1;
  EnumValueOptions::EnumValueOptions((EnumValueOptions *)&_EnumValueOptions_default_instance_);
  DAT_004305b0 = 1;
  ServiceOptions::ServiceOptions((ServiceOptions *)&_ServiceOptions_default_instance_);
  DAT_00430628 = 1;
  MethodOptions::MethodOptions((MethodOptions *)&_MethodOptions_default_instance_);
  DAT_004306a0 = 1;
  UninterpretedOption_NamePart::UninterpretedOption_NamePart
            ((UninterpretedOption_NamePart *)&_UninterpretedOption_NamePart_default_instance_);
  DAT_004306d0 = 1;
  UninterpretedOption::UninterpretedOption
            ((UninterpretedOption *)&_UninterpretedOption_default_instance_);
  DAT_00430738 = 1;
  SourceCodeInfo_Location::SourceCodeInfo_Location
            ((SourceCodeInfo_Location *)&_SourceCodeInfo_Location_default_instance_);
  DAT_004307b0 = 1;
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&_SourceCodeInfo_default_instance_);
  DAT_004307e8 = 1;
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)&_GeneratedCodeInfo_Annotation_default_instance_);
  DAT_00430830 = 1;
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&_GeneratedCodeInfo_default_instance_);
  DAT_0042ffb0 = &_FileOptions_default_instance_;
  DAT_0042ffb8 = &_SourceCodeInfo_default_instance_;
  DAT_004300f8 = &_MessageOptions_default_instance_;
  DAT_00430148 = &_FieldOptions_default_instance_;
  DAT_00430188 = &_OneofOptions_default_instance_;
  DAT_004301d0 = &_EnumOptions_default_instance_;
  DAT_00430200 = &_EnumValueOptions_default_instance_;
  DAT_00430250 = &_ServiceOptions_default_instance_;
  DAT_00430290 = &_MethodOptions_default_instance_;
  DAT_00430868 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _FileDescriptorSet_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.DefaultConstruct();
  _DescriptorProto_ExtensionRange_default_instance_.DefaultConstruct();
  _DescriptorProto_ReservedRange_default_instance_.DefaultConstruct();
  _DescriptorProto_default_instance_.DefaultConstruct();
  _FieldDescriptorProto_default_instance_.DefaultConstruct();
  _OneofDescriptorProto_default_instance_.DefaultConstruct();
  _EnumDescriptorProto_default_instance_.DefaultConstruct();
  _EnumValueDescriptorProto_default_instance_.DefaultConstruct();
  _ServiceDescriptorProto_default_instance_.DefaultConstruct();
  _MethodDescriptorProto_default_instance_.DefaultConstruct();
  _FileOptions_default_instance_.DefaultConstruct();
  _MessageOptions_default_instance_.DefaultConstruct();
  _FieldOptions_default_instance_.DefaultConstruct();
  _OneofOptions_default_instance_.DefaultConstruct();
  _EnumOptions_default_instance_.DefaultConstruct();
  _EnumValueOptions_default_instance_.DefaultConstruct();
  _ServiceOptions_default_instance_.DefaultConstruct();
  _MethodOptions_default_instance_.DefaultConstruct();
  _UninterpretedOption_NamePart_default_instance_.DefaultConstruct();
  _UninterpretedOption_default_instance_.DefaultConstruct();
  _SourceCodeInfo_Location_default_instance_.DefaultConstruct();
  _SourceCodeInfo_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_Annotation_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FileOptions*>(
      ::google::protobuf::FileOptions::internal_default_instance());
  _FileDescriptorProto_default_instance_.get_mutable()->source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(
      ::google::protobuf::SourceCodeInfo::internal_default_instance());
  _DescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MessageOptions*>(
      ::google::protobuf::MessageOptions::internal_default_instance());
  _FieldDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FieldOptions*>(
      ::google::protobuf::FieldOptions::internal_default_instance());
  _OneofDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::OneofOptions*>(
      ::google::protobuf::OneofOptions::internal_default_instance());
  _EnumDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumOptions*>(
      ::google::protobuf::EnumOptions::internal_default_instance());
  _EnumValueDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumValueOptions*>(
      ::google::protobuf::EnumValueOptions::internal_default_instance());
  _ServiceDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::ServiceOptions*>(
      ::google::protobuf::ServiceOptions::internal_default_instance());
  _MethodDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MethodOptions*>(
      ::google::protobuf::MethodOptions::internal_default_instance());
}